

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_operhlp.c
# Opt level: O0

void clean_getout(OperationConfig *config)

{
  getout *pgVar1;
  getout *local_20;
  getout *node;
  getout *next;
  OperationConfig *config_local;
  
  if (config != (OperationConfig *)0x0) {
    local_20 = config->url_list;
    while (local_20 != (getout *)0x0) {
      pgVar1 = local_20->next;
      free(local_20->url);
      local_20->url = (char *)0x0;
      free(local_20->outfile);
      local_20->outfile = (char *)0x0;
      free(local_20->infile);
      local_20->infile = (char *)0x0;
      free(local_20);
      local_20 = pgVar1;
    }
    config->url_list = (getout *)0x0;
  }
  return;
}

Assistant:

void clean_getout(struct OperationConfig *config)
{
  if(config) {
    struct getout *next;
    struct getout *node = config->url_list;

    while(node) {
      next = node->next;
      Curl_safefree(node->url);
      Curl_safefree(node->outfile);
      Curl_safefree(node->infile);
      Curl_safefree(node);
      node = next;
    }
    config->url_list = NULL;
  }
}